

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O3

void __thiscall
Lib::
Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>_>_>::Bucket,_Lib::DefaultHash>
::expand(Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>_>_>::Bucket,_Lib::DefaultHash>
         *this)

{
  long lVar1;
  Entry *array;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Entry *p;
  Entry *pEVar5;
  long lVar6;
  void **head;
  int iVar7;
  ulong uVar8;
  Entry *pEVar9;
  size_t length;
  int iVar11;
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  int iVar14;
  undefined1 auVar13 [16];
  
  length = (size_t)this->_capacity;
  iVar7 = 0x20;
  if (length != 0) {
    iVar7 = this->_capacity * 2;
  }
  this->_capacity = iVar7;
  array = this->_entries;
  if (iVar7 == 0) {
    pEVar5 = (Entry *)FixedSizeAllocator<8UL>::alloc
                                ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
  }
  else {
    uVar8 = (long)iVar7 * 0x38;
    if (uVar8 < 0x11) {
      pEVar5 = (Entry *)FixedSizeAllocator<16UL>::alloc
                                  ((FixedSizeAllocator<16UL> *)
                                   (GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    }
    else if (uVar8 < 0x19) {
      pEVar5 = (Entry *)FixedSizeAllocator<24UL>::alloc
                                  ((FixedSizeAllocator<24UL> *)
                                   (GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
    }
    else if (uVar8 < 0x21) {
      pEVar5 = (Entry *)FixedSizeAllocator<32UL>::alloc
                                  ((FixedSizeAllocator<32UL> *)
                                   (GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
    }
    else if (uVar8 < 0x31) {
      pEVar5 = (Entry *)FixedSizeAllocator<48UL>::alloc
                                  ((FixedSizeAllocator<48UL> *)
                                   (GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    }
    else if (uVar8 < 0x41) {
      pEVar5 = (Entry *)FixedSizeAllocator<64UL>::alloc
                                  ((FixedSizeAllocator<64UL> *)
                                   (GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    }
    else {
      pEVar5 = (Entry *)::operator_new(uVar8,0x10);
    }
  }
  auVar4 = _DAT_0084f040;
  auVar3 = _DAT_0084f030;
  auVar2 = _DAT_0084f020;
  iVar7 = this->_capacity;
  lVar6 = (long)iVar7;
  if (lVar6 != 0) {
    lVar1 = lVar6 + -1;
    auVar10._8_4_ = (int)lVar1;
    auVar10._0_8_ = lVar1;
    auVar10._12_4_ = (int)((ulong)lVar1 >> 0x20);
    uVar8 = 0;
    auVar10 = auVar10 ^ _DAT_0084f040;
    pEVar9 = pEVar5;
    do {
      auVar12._8_4_ = (int)uVar8;
      auVar12._0_8_ = uVar8;
      auVar12._12_4_ = (int)(uVar8 >> 0x20);
      auVar13 = (auVar12 | auVar3) ^ auVar4;
      iVar11 = auVar10._4_4_;
      if ((bool)(~(auVar13._4_4_ == iVar11 && auVar10._0_4_ < auVar13._0_4_ ||
                  iVar11 < auVar13._4_4_) & 1)) {
        pEVar9->code = 0;
      }
      if ((auVar13._12_4_ != auVar10._12_4_ || auVar13._8_4_ <= auVar10._8_4_) &&
          auVar13._12_4_ <= auVar10._12_4_) {
        pEVar9[1].code = 0;
      }
      auVar12 = (auVar12 | auVar2) ^ auVar4;
      iVar14 = auVar12._4_4_;
      if (iVar14 <= iVar11 && (iVar14 != iVar11 || auVar12._0_4_ <= auVar10._0_4_)) {
        pEVar9[2].code = 0;
        pEVar9[3].code = 0;
      }
      uVar8 = uVar8 + 4;
      pEVar9 = pEVar9 + 4;
    } while ((lVar6 + 3U & 0xfffffffffffffffc) != uVar8);
  }
  this->_entries = pEVar5;
  this->_afterLast = pEVar5 + lVar6;
  this->_maxEntries = (int)((double)iVar7 * 0.8);
  iVar7 = this->_noOfEntries;
  this->_noOfEntries = 0;
  pEVar5 = array;
  for (; iVar7 != 0; iVar7 = iVar7 + -1) {
    do {
      pEVar9 = pEVar5;
      pEVar5 = pEVar9 + 1;
    } while (pEVar9->code == 0);
    insert(this,(uint *)(pEVar9->_key).__data,(Bucket *)&(pEVar9->_value).__align,pEVar9->code);
  }
  if (array != (Entry *)0x0) {
    array_delete<Lib::Map<unsigned_int,Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>>>::Bucket,Lib::DefaultHash>::Entry>
              (array,length);
    uVar8 = length * 0x38 + 0xf & 0xfffffffffffffff0;
    if (uVar8 == 0) {
      array->code = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_4_;
      array->_key = (MaybeUninit<unsigned_int>)GLOBAL_SMALL_OBJECT_ALLOCATOR._20_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = array;
    }
    else if (uVar8 < 0x11) {
      array->code = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_4_;
      array->_key = (MaybeUninit<unsigned_int>)GLOBAL_SMALL_OBJECT_ALLOCATOR._44_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = array;
    }
    else if (uVar8 < 0x19) {
      array->code = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_4_;
      array->_key = (MaybeUninit<unsigned_int>)GLOBAL_SMALL_OBJECT_ALLOCATOR._68_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = array;
    }
    else if (uVar8 < 0x21) {
      array->code = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_4_;
      array->_key = (MaybeUninit<unsigned_int>)GLOBAL_SMALL_OBJECT_ALLOCATOR._92_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = array;
    }
    else if (uVar8 < 0x31) {
      array->code = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_4_;
      array->_key = (MaybeUninit<unsigned_int>)GLOBAL_SMALL_OBJECT_ALLOCATOR._116_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = array;
    }
    else {
      if (0x40 < uVar8) {
        operator_delete(array,0x10);
        return;
      }
      array->code = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_4_;
      array->_key = (MaybeUninit<unsigned_int>)GLOBAL_SMALL_OBJECT_ALLOCATOR._140_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = array;
    }
  }
  return;
}

Assistant:

void expand()
  {
    size_t oldCapacity = _capacity;
    _capacity = _capacity ? _capacity * 2 : 32;

    Entry* oldEntries = _entries;

    void* mem = ALLOC_KNOWN(sizeof(Entry)*_capacity,"Map<>");
    _entries = array_new<Entry>(mem, _capacity);

    _afterLast = _entries + _capacity;
    _maxEntries = (int)(_capacity * 0.8);
    // experiments using (a) random numbers (b) consecutive numbers
    // and (1) int->int 20M allocations (2) string->int 10M allocations
    // and 30,000,000 allocations
    // 0.6 : 6.80 4.87 20.8 14.9 32.6 14
    // 0.7 : 6.58 5.61 23.1 15.2 35.2 16.6
    // 0.8 : 6.36 5.77 24.0 15.4 36.0 17.4
    // 0.9 : 7.54 6.04 25.4 15.2 37.0 18.4
    // copy old entries
    Entry* current = oldEntries;
    int remaining = _noOfEntries;
    _noOfEntries = 0;
    while (remaining != 0) {
      // find first occupied entry
      while (! current->occupied()) {
        current ++;
      }
      // now current is occupied
      insert(std::move(current->key()),std::move(current->value()),current->code);
      current ++;
      remaining --;
    }
    if (oldEntries) {
      array_delete(oldEntries, oldCapacity);
      DEALLOC_KNOWN(oldEntries,sizeof(Entry)*oldCapacity,"Map<>");
    }
  }